

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  uint uVar10;
  void *pvVar11;
  RepeatedPtrFieldBase *pRVar12;
  MessageLite *msg_00;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar15;
  uint uVar16;
  ParseContext *extraout_RDX;
  ParseContext *pPVar17;
  Arena *this;
  RepeatedPtrFieldBase *ptr_00;
  ushort uVar18;
  uint *puVar19;
  undefined8 *unaff_R15;
  pair<const_char_*,_unsigned_int> pVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_70;
  TcParser local_48 [16];
  RepeatedPtrFieldBase *local_38;
  
  puVar19 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar19 & 3) != 0) {
LAB_002236c6:
    AlignFail(puVar19);
  }
  uVar6 = *(ushort *)((long)puVar19 + 10);
  if ((uVar6 & 0x30) == 0x20) {
    if ((uVar6 & 0x1c0) == 0x40) {
      uVar10 = data.field_0._0_4_;
      if ((uVar10 & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_00223627:
        pcVar14 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar14;
      }
      pvVar11 = MaybeGetSplitBase(msg,true,table);
      unaff_R15 = (undefined8 *)((ulong)*puVar19 + (long)pvVar11);
      if (((ulong)unaff_R15 & 7) == 0) {
        pRVar12 = (RepeatedPtrFieldBase *)*unaff_R15;
        if (pRVar12 == (RepeatedPtrFieldBase *)kZeroBuffer) {
          this = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)this & 1) != 0) {
            this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
          }
          if (this == (Arena *)0x0) {
            pRVar12 = (RepeatedPtrFieldBase *)operator_new(0x18);
            pRVar12->tagged_rep_or_elem_ = (void *)0x0;
            pRVar12->current_size_ = 0;
            pRVar12->capacity_proxy_ = 0;
            pRVar12->arena_ = (Arena *)0x0;
          }
          else {
            pRVar12 = (RepeatedPtrFieldBase *)Arena::Allocate(this,0x18);
            pRVar12->tagged_rep_or_elem_ = (void *)0x0;
            pRVar12->current_size_ = 0;
            pRVar12->capacity_proxy_ = 0;
            pRVar12->arena_ = this;
          }
          *unaff_R15 = pRVar12;
        }
        aVar15.data = (long)&table->has_bits_offset + (ulong)table->aux_offset;
        local_70 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    (aVar15.data + (ulong)(ushort)puVar19[2] * 8);
        uVar18 = uVar6 >> 9 & 3;
        ptr_00 = (RepeatedPtrFieldBase *)ptr;
        if (uVar18 != 2) {
          if ((uVar6 >> 9 & 3) == 0) {
            MpRepeatedMessageOrGroup<true,true>(local_48);
            goto LAB_00223757;
          }
          if (uVar18 != 1) {
            local_70.data = *local_70.data;
          }
          local_70.data = (uint64_t)MessageLite::GetTcParseTable(local_70.data);
        }
        do {
          local_38 = pRVar12;
          pRVar12 = local_38;
          msg_00 = AddMessage((TcParseTableBase *)local_70,local_38);
          uVar16 = ctx->depth_;
          puVar19 = (uint *)(ulong)uVar16;
          ctx->depth_ = uVar16 - 1;
          pPVar17 = ctx;
          if ((int)uVar16 < 1) {
LAB_00223653:
            pcVar14 = Error(msg,(char *)pRVar12,pPVar17,(TcFieldData)aVar15,table,hasbits);
            return pcVar14;
          }
          iVar7 = ctx->group_depth_;
          uVar1 = iVar7 + 1;
          ctx->group_depth_ = uVar1;
          aVar15 = local_70;
          ptr = ParseLoopPreserveNone(msg_00,(char *)ptr_00,ctx,(TcParseTableBase *)local_70);
          pPVar17 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) {
            uVar2 = ctx->depth_;
            uVar3 = ctx->group_depth_;
            ctx->depth_ = uVar2 + 1;
            ctx->group_depth_ = uVar3 + -1;
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
            pRVar12 = ptr_00;
            goto LAB_00223653;
          }
          if (uVar16 - 1 != ctx->depth_) {
            MpRepeatedMessageOrGroup<true,true>();
LAB_002236b9:
            MpRepeatedMessageOrGroup<true,true>();
            goto LAB_002236c6;
          }
          uVar8 = ctx->group_depth_;
          if (uVar1 != uVar8) goto LAB_002236b9;
          ctx->group_depth_ = iVar7;
          ctx->depth_ = uVar16;
          uVar16 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          pRVar12 = (RepeatedPtrFieldBase *)(ulong)uVar8;
          if (((ushort *)ptr == (ushort *)0x0) || (uVar16 != uVar10)) goto LAB_00223653;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_00223675;
          bVar4 = (byte)*(ushort *)ptr;
          auVar9[8] = bVar4;
          auVar9._0_8_ = (byte *)((long)ptr + 1);
          auVar9._9_3_ = 0;
          if ((char)bVar4 < '\0') {
            bVar5 = *(byte *)((long)ptr + 1);
            aVar15.data = (ulong)bVar5 << 7;
            uVar16 = ((uint)bVar4 + (uint)bVar5 * 0x80) - 0x80;
            if ((char)bVar5 < '\0') {
              pRVar12 = (RepeatedPtrFieldBase *)(ulong)uVar16;
              pVar20 = ReadTagFallback(ptr,uVar16);
              auVar9 = pVar20._0_12_;
              pPVar17 = pVar20._8_8_;
              if (pVar20.first == (char *)0x0) goto LAB_00223653;
            }
            else {
              auVar9._8_4_ = uVar16;
              auVar9._0_8_ = (ushort *)((long)ptr + 2);
            }
          }
          ptr_00 = auVar9._0_8_;
          pRVar12 = local_38;
        } while (auVar9._8_4_ == uVar10);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_00223675:
          if ((ulong)table->has_bits_offset != 0) {
            puVar19 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
            if (((ulong)puVar19 & 3) != 0) {
LAB_00223757:
              AlignFail();
            }
            *puVar19 = *puVar19 | (uint)hasbits;
          }
          return (char *)(ushort *)ptr;
        }
        uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar10 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar13 = (ulong)(uVar10 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar13 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar13);
        goto LAB_00223627;
      }
      goto LAB_002236e2;
    }
  }
  else {
    MpRepeatedMessageOrGroup<true,true>();
  }
  MpRepeatedMessageOrGroup<true,true>();
LAB_002236e2:
  AlignFail(unaff_R15);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}